

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O1

idx_t duckdb::ExpressionHeuristics::Cost(TableFilter *filter)

{
  PhysicalType PVar1;
  pointer puVar2;
  StructFilter *pSVar3;
  ConjunctionOrFilter *pCVar4;
  ConstantFilter *pCVar5;
  ConjunctionAndFilter *pCVar6;
  type pTVar7;
  idx_t iVar8;
  idx_t iVar9;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *child_filter;
  pointer puVar10;
  
  while (filter->filter_type == STRUCT_EXTRACT) {
    pSVar3 = TableFilter::Cast<duckdb::StructFilter>(filter);
    filter = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
             operator*(&pSVar3->child_filter);
  }
  switch(filter->filter_type) {
  case CONSTANT_COMPARISON:
    pCVar5 = TableFilter::Cast<duckdb::ConstantFilter>(filter);
    PVar1 = (pCVar5->constant).type_.physical_type_;
    if (PVar1 - 0xb < 2) {
      return 2;
    }
    if (PVar1 != VARCHAR) {
      return 1;
    }
    break;
  case IS_NULL:
  case IS_NOT_NULL:
    break;
  case CONJUNCTION_OR:
    pCVar4 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(filter);
    puVar10 = (pCVar4->super_ConjunctionFilter).child_filters.
              super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (pCVar4->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar10 != puVar2) {
      iVar9 = 5;
      do {
        pTVar7 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*(puVar10);
        iVar8 = Cost(pTVar7);
        iVar9 = iVar9 + iVar8;
        puVar10 = puVar10 + 1;
      } while (puVar10 != puVar2);
      return iVar9;
    }
    break;
  case CONJUNCTION_AND:
    pCVar6 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    puVar10 = (pCVar6->super_ConjunctionFilter).child_filters.
              super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (pCVar6->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar10 != puVar2) {
      iVar9 = 5;
      do {
        pTVar7 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*(puVar10);
        iVar8 = Cost(pTVar7);
        iVar9 = iVar9 + iVar8;
        puVar10 = puVar10 + 1;
      } while (puVar10 != puVar2);
      return iVar9;
    }
    break;
  default:
    return 1000;
  case OPTIONAL_FILTER:
  case DYNAMIC_FILTER:
    return 0;
  }
  return 5;
}

Assistant:

idx_t ExpressionHeuristics::Cost(TableFilter &filter) {
	switch (filter.filter_type) {
	case TableFilterType::DYNAMIC_FILTER:
	case TableFilterType::OPTIONAL_FILTER:
		return 0;
	case TableFilterType::CONJUNCTION_OR: {
		auto &conjunction_and = filter.Cast<ConjunctionOrFilter>();
		idx_t cost = 5;
		for (auto &child_filter : conjunction_and.child_filters) {
			cost += Cost(*child_filter);
		}
		return cost;
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_and = filter.Cast<ConjunctionAndFilter>();
		idx_t cost = 5;
		for (auto &child_filter : conjunction_and.child_filters) {
			cost += Cost(*child_filter);
		}
		return cost;
	}
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = filter.Cast<ConstantFilter>();
		return ExpressionCost(constant_filter.constant.type().InternalType(), 1);
	}
	case TableFilterType::IS_NULL:
	case TableFilterType::IS_NOT_NULL:
		return 5;
	case TableFilterType::STRUCT_EXTRACT: {
		auto &struct_filter = filter.Cast<StructFilter>();
		return Cost(*struct_filter.child_filter);
	}
	default:
		return 1000;
	}
}